

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseBlockInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Expr *pEVar1;
  IfExceptExpr *pIVar2;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> uVar3;
  bool bVar4;
  TokenType TVar5;
  Result RVar6;
  undefined8 uVar7;
  Token local_1a8;
  Token local_158;
  Token local_108;
  undefined1 auStack_b8 [8];
  Location loc;
  unique_ptr<wabt::IfExpr,_std::default_delete<wabt::IfExpr>_> expr_2;
  IfExceptExpr *pIStack_78;
  unique_ptr<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> expr;
  undefined8 local_68;
  undefined8 uStack_60;
  IfExceptExpr *local_28;
  unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_> expr_1;
  
  GetToken((Token *)&stack0xffffffffffffff88,this);
  auStack_b8 = (undefined1  [8])pIStack_78;
  loc.filename.data_ =
       (char *)expr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
               super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl;
  Token::~Token((Token *)&stack0xffffffffffffff88);
  TVar5 = Peek(this,0);
  if ((int)TVar5 < 0x40) {
    if (TVar5 != Block) {
      if (TVar5 != IfExcept) {
LAB_00f74561:
        __assert_fail("!\"ParseBlockInstr should only be called when IsBlockInstr() is true\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                      ,0x72d,"Result wabt::WastParser::ParseBlockInstr(std::unique_ptr<Expr> *)");
      }
      Consume((Token *)&stack0xffffffffffffff88,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)&stack0xffffffffffffff88);
      Token::~Token((Token *)&stack0xffffffffffffff88);
      MakeUnique<wabt::IfExceptExpr,wabt::Location&>((wabt *)&local_28,(Location *)auStack_b8);
      RVar6 = ParseIfExceptHeader(this,local_28);
      uVar7 = local_28;
      if ((RVar6.enum_ != Error) &&
         (RVar6 = ParseInstrList(this,&(local_28->true_).exprs), uVar7 = local_28,
         RVar6.enum_ != Error)) {
        GetToken((Token *)&stack0xffffffffffffff88,this);
        uVar3 = expr;
        loc.field_1._8_8_ = pIStack_78;
        Token::~Token((Token *)&stack0xffffffffffffff88);
        (local_28->true_).end_loc.field_1.field_1.offset = local_68;
        *(undefined8 *)((long)&(local_28->true_).end_loc.field_1 + 8) = uStack_60;
        (local_28->true_).end_loc.filename.data_ = loc.field_1._8_8_;
        (local_28->true_).end_loc.filename.size_ =
             (size_type)
             uVar3._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
             super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl;
        bVar4 = Match(this,Else);
        if (bVar4) {
          RVar6 = ParseEndLabelOpt(this,&(local_28->true_).label);
          uVar7 = local_28;
          if ((RVar6.enum_ == Error) ||
             (RVar6 = ParseTerminatingInstrList(this,&local_28->false_), uVar7 = local_28,
             RVar6.enum_ == Error)) goto LAB_00f744c1;
          GetLocation((Location *)&stack0xffffffffffffff88,this);
          (local_28->false_end_loc).field_1.field_1.offset = local_68;
          *(undefined8 *)((long)&(local_28->false_end_loc).field_1 + 8) = uStack_60;
          (local_28->false_end_loc).filename.data_ = (char *)pIStack_78;
          (local_28->false_end_loc).filename.size_ =
               (size_type)
               expr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
               super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl;
        }
        RVar6 = Expect(this,End);
        uVar7 = local_28;
        if ((RVar6.enum_ != Error) &&
           (RVar6 = ParseEndLabelOpt(this,&(local_28->true_).label), pIVar2 = local_28,
           uVar7 = local_28, RVar6.enum_ != Error)) {
          local_28 = (IfExceptExpr *)0x0;
          pEVar1 = (out_expr->_M_t).
                   super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                   super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                   super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
          (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
          super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pIVar2;
          uVar7 = local_28;
          if (pEVar1 != (Expr *)0x0) {
            (*pEVar1->_vptr_Expr[1])();
            uVar7 = local_28;
          }
          goto LAB_00f7454f;
        }
      }
      goto LAB_00f744c1;
    }
    Consume(&local_1a8,this);
    Token::~Token(&local_1a8);
    MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Location&>
              ((wabt *)&stack0xffffffffffffff88,(Location *)auStack_b8);
    RVar6 = ParseLabelOpt(this,&(pIStack_78->true_).label);
    uVar7 = pIStack_78;
    if (((RVar6.enum_ == Error) ||
        (RVar6 = ParseBlock(this,&pIStack_78->true_), uVar7 = pIStack_78, RVar6.enum_ == Error)) ||
       (RVar6 = Expect(this,End), uVar7 = pIStack_78, RVar6.enum_ == Error)) goto LAB_00f744c1;
    RVar6 = ParseEndLabelOpt(this,&(pIStack_78->true_).label);
  }
  else {
    if (TVar5 == If) {
      Consume(&local_108,this);
      Token::~Token(&local_108);
      MakeUnique<wabt::IfExpr,wabt::Location&>
                ((wabt *)(loc.field_1.field2 + 8),(Location *)auStack_b8);
      RVar6 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
      uVar7 = loc.field_1._8_8_;
      if ((RVar6.enum_ != Error) &&
         (RVar6 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)), uVar7 = loc.field_1._8_8_,
         RVar6.enum_ != Error)) {
        bVar4 = Match(this,Else);
        if (bVar4) {
          RVar6 = ParseEndLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
          uVar7 = loc.field_1._8_8_;
          if ((RVar6.enum_ == Error) ||
             (RVar6 = ParseTerminatingInstrList(this,(ExprList *)(loc.field_1._8_8_ + 0x118)),
             uVar7 = loc.field_1._8_8_, RVar6.enum_ == Error)) goto LAB_00f744c1;
          GetLocation((Location *)&stack0xffffffffffffff88,this);
          ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
          (loc.field_1._8_8_ + 0x140))->offset = local_68;
          *(undefined8 *)(loc.field_1._8_8_ + 0x148) = uStack_60;
          *(IfExceptExpr **)(loc.field_1._8_8_ + 0x130) = pIStack_78;
          ((__uniq_ptr_data<wabt::TryExpr,_std::default_delete<wabt::TryExpr>,_true,_true> *)
          (loc.field_1._8_8_ + 0x138))->
          super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_> =
               (__uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>)
               expr._M_t.super___uniq_ptr_impl<wabt::TryExpr,_std::default_delete<wabt::TryExpr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::TryExpr_*,_std::default_delete<wabt::TryExpr>_>.
               super__Head_base<0UL,_wabt::TryExpr_*,_false>._M_head_impl;
        }
        RVar6 = Expect(this,End);
        uVar7 = loc.field_1._8_8_;
        if ((RVar6.enum_ == Error) ||
           (RVar6 = ParseEndLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40)),
           uVar7 = loc.field_1._8_8_, RVar6.enum_ == Error)) goto LAB_00f744c1;
        loc.field_1._8_8_ = 0;
        pEVar1 = (out_expr->_M_t).
                 super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                 super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                 super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
        (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
        super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
        super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)uVar7;
        uVar7 = loc.field_1._8_8_;
        if (pEVar1 != (Expr *)0x0) {
          (*pEVar1->_vptr_Expr[1])();
          uVar7 = loc.field_1._8_8_;
        }
        goto LAB_00f7454f;
      }
      goto LAB_00f744c1;
    }
    if (TVar5 == Loop) {
      Consume(&local_158,this);
      Token::~Token(&local_158);
      MakeUnique<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Location&>
                ((wabt *)&stack0xffffffffffffff88,(Location *)auStack_b8);
      RVar6 = ParseLabelOpt(this,&(pIStack_78->true_).label);
      uVar7 = pIStack_78;
      if (((RVar6.enum_ == Error) ||
          (RVar6 = ParseBlock(this,&pIStack_78->true_), uVar7 = pIStack_78, RVar6.enum_ == Error))
         || (RVar6 = Expect(this,End), uVar7 = pIStack_78, RVar6.enum_ == Error)) goto LAB_00f744c1;
      RVar6 = ParseEndLabelOpt(this,&(pIStack_78->true_).label);
    }
    else {
      if (TVar5 != Try) goto LAB_00f74561;
      Consume((Token *)&stack0xffffffffffffff88,this);
      ErrorUnlessOpcodeEnabled(this,(Token *)&stack0xffffffffffffff88);
      Token::~Token((Token *)&stack0xffffffffffffff88);
      MakeUnique<wabt::TryExpr,wabt::Location&>
                ((wabt *)&stack0xffffffffffffff88,(Location *)auStack_b8);
      RVar6 = ParseLabelOpt(this,&(pIStack_78->true_).label);
      uVar7 = pIStack_78;
      if ((((RVar6.enum_ == Error) ||
           (RVar6 = ParseBlock(this,&pIStack_78->true_), uVar7 = pIStack_78, RVar6.enum_ == Error))
          || ((RVar6 = Expect(this,Catch), uVar7 = pIStack_78, RVar6.enum_ == Error ||
              ((RVar6 = ParseEndLabelOpt(this,&(pIStack_78->true_).label), uVar7 = pIStack_78,
               RVar6.enum_ == Error ||
               (RVar6 = ParseTerminatingInstrList(this,&pIStack_78->false_), uVar7 = pIStack_78,
               RVar6.enum_ == Error)))))) ||
         (RVar6 = Expect(this,End), uVar7 = pIStack_78, RVar6.enum_ == Error)) goto LAB_00f744c1;
      RVar6 = ParseEndLabelOpt(this,&(pIStack_78->true_).label);
    }
  }
  pIVar2 = pIStack_78;
  uVar7 = pIStack_78;
  if (RVar6.enum_ != Error) {
    pIStack_78 = (IfExceptExpr *)0x0;
    pEVar1 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pIVar2;
    uVar7 = pIStack_78;
    if (pEVar1 != (Expr *)0x0) {
      (*pEVar1->_vptr_Expr[1])();
      uVar7 = pIStack_78;
    }
LAB_00f7454f:
    if ((IfExceptExpr *)uVar7 != (IfExceptExpr *)0x0) {
      (*(((IfExceptExpr *)uVar7)->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])();
    }
    return (Result)Ok;
  }
LAB_00f744c1:
  if ((IfExceptExpr *)uVar7 != (IfExceptExpr *)0x0) {
    (*(((IfExceptExpr *)uVar7)->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])();
  }
  return (Result)Error;
}

Assistant:

Result WastParser::ParseBlockInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParseBlockInstr);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Block: {
      Consume();
      auto expr = MakeUnique<BlockExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Loop: {
      Consume();
      auto expr = MakeUnique<LoopExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::If: {
      Consume();
      auto expr = MakeUnique<IfExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
      CHECK_RESULT(ParseBlock(&expr->true_));
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::IfExcept: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<IfExceptExpr>(loc);
      CHECK_RESULT(ParseIfExceptHeader(expr.get()));
      CHECK_RESULT(ParseInstrList(&expr->true_.exprs));
      expr->true_.end_loc = GetLocation();
      if (Match(TokenType::Else)) {
        CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
        CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
        expr->false_end_loc = GetLocation();
      }
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->true_.label));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Try: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<TryExpr>(loc);
      CHECK_RESULT(ParseLabelOpt(&expr->block.label));
      CHECK_RESULT(ParseBlock(&expr->block));
      EXPECT(Catch);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
      EXPECT(End);
      CHECK_RESULT(ParseEndLabelOpt(expr->block.label));
      *out_expr = std::move(expr);
      break;
    }

    default:
      assert(
          !"ParseBlockInstr should only be called when IsBlockInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}